

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlNewDocNode(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  xmlChar *pxVar1;
  xmlNodePtr pxVar2;
  
  if (name != (xmlChar *)0x0) {
    if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
      pxVar1 = xmlStrdup(name);
      if (pxVar1 != (xmlChar *)0x0) {
        pxVar2 = xmlNewElem(doc,ns,pxVar1,content);
        if (pxVar2 != (xmlNodePtr)0x0) {
          return pxVar2;
        }
        (*xmlFree)(pxVar1);
      }
    }
    else {
      pxVar1 = xmlDictLookup(doc->dict,name,-1);
      if (pxVar1 != (xmlChar *)0x0) {
        pxVar2 = xmlNewElem(doc,ns,pxVar1,content);
        return pxVar2;
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlNewDocNode(xmlDocPtr doc, xmlNsPtr ns,
              const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;
    xmlChar *copy;

    if (name == NULL)
        return(NULL);

    if ((doc != NULL) && (doc->dict != NULL)) {
        const xmlChar *dictName = xmlDictLookup(doc->dict, name, -1);

        if (dictName == NULL)
            return(NULL);
        return(xmlNewElem(doc, ns, dictName, content));
    }

    copy = xmlStrdup(name);
    if (copy == NULL)
        return(NULL);

    cur = xmlNewElem(doc, ns, copy, content);
    if (cur == NULL) {
        xmlFree(copy);
        return(NULL);
    }

    return(cur);
}